

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonutil.cpp
# Opt level: O3

vec3f json2vec3f(Json *o)

{
  undefined8 *puVar1;
  vec3f vVar2;
  vector<float,_std::allocator<float>_> a;
  float local_40;
  undefined4 uStack_3c;
  pointer local_38;
  pointer local_30;
  undefined1 local_28 [16];
  undefined8 local_18;
  undefined8 uStack_10;
  
  if ((byte)(o->m_type - number_integer) < 3) {
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
              (o,&local_40);
    local_18._4_4_ = local_40;
    local_28._0_4_ = local_40;
  }
  else {
    if (o->m_type != array) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = "failed convert json to vec3f";
      __cxa_throw(puVar1,&char_const*::typeinfo,0);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get<std::vector<float,_std::allocator<float>_>,_std::vector<float,_std::allocator<float>_>,_0>
              ((vector<float,_std::allocator<float>_> *)&local_40,o);
    puVar1 = (undefined8 *)CONCAT44(uStack_3c,local_40);
    if ((long)local_38 - (long)puVar1 != 0xc) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = "vector size mismatched";
      __cxa_throw(puVar1,&char_const*::typeinfo,0);
    }
    local_18 = *puVar1;
    uStack_10 = 0;
    local_28 = ZEXT416(*(uint *)(puVar1 + 1));
    operator_delete(puVar1,(long)local_30 - (long)puVar1);
    local_40 = (float)local_18;
  }
  vVar2.y = local_18._4_4_;
  vVar2.x = local_40;
  vVar2.z = (float)local_28._0_4_;
  return vVar2;
}

Assistant:

vec3f json2vec3f(const Json& o) {
	if (is_number(o))
		return vec3f(o);
	if (o.type() != Json::value_t::array)
		throw "failed convert json to vec3f";
	std::vector<float> a = o;
	if (a.size()!=3) throw "vector size mismatched";
	return vec3f(a[0], a[1], a[2]);
}